

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QList<QString>_>_>::freeData
          (Span<QHashPrivate::Node<QString,_QList<QString>_>_> *this)

{
  uchar *puVar1;
  Entry *pEVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  
  if (this->entries != (Entry *)0x0) {
    lVar5 = 0;
    do {
      if (this->offsets[lVar5] != 0xff) {
        pEVar2 = this->entries;
        uVar4 = (uint)this->offsets[lVar5] * 0x30;
        puVar1 = (pEVar2->storage).data + uVar4;
        QArrayDataPointer<QString>::~QArrayDataPointer
                  ((QArrayDataPointer<QString> *)(puVar1 + 0x18));
        piVar3 = *(int **)puVar1;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate(*(QArrayData **)((pEVar2->storage).data + uVar4),2,0x10);
          }
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }